

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini2sf.cpp
# Opt level: O2

void printUsage(char *cmd)

{
  undefined *puVar1;
  int i;
  ulong uVar2;
  
  printf("%s %s\n","rom2sf","[2015-04-08]");
  puts("======================");
  putchar(10);
  printf("%s. Created by %s.\n","Numbered mini2sf generator",
         "loveemu <http://github.com/loveemu/rom2sf>");
  putchar(10);
  puts("Usage");
  puts("-----");
  putchar(10);
  printf("Syntax: `%s <Base name> <Offset> <Size> <Count>`\n",cmd);
  putchar(10);
  puts("### Options ###");
  putchar(10);
  for (uVar2 = 0; uVar2 < 4; uVar2 = uVar2 + 2) {
    puVar1 = (&PTR_anon_var_dwarf_5c_00106d98)[uVar2];
    puts((&PTR_anon_var_dwarf_39_00106d90)[uVar2]);
    printf("  : %s\n",puVar1);
    putchar(10);
  }
  return;
}

Assistant:

void printUsage(const char *cmd)
{
	const char *availableOptions[] = {
		"--help", "Show this help",
		"--psfby, --2sfby [name]", "Set creator name of 2SF",
	};

	printf("%s %s\n", APP_NAME, APP_VER);
	printf("======================\n");
	printf("\n");
	printf("%s. Created by %s.\n", APP_DESC, APP_AUTHOR);
	printf("\n");
	printf("Usage\n");
	printf("-----\n");
	printf("\n");
	printf("Syntax: `%s <Base name> <Offset> <Size> <Count>`\n", cmd);
	printf("\n");
	printf("### Options ###\n");
	printf("\n");

	for (int i = 0; i < sizeof(availableOptions) / sizeof(availableOptions[0]); i += 2)
	{
		printf("%s\n", availableOptions[i]);
		printf("  : %s\n", availableOptions[i + 1]);
		printf("\n");
	}
}